

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

void wallet::InterpretFeeEstimationInstructions
               (UniValue *conf_target,UniValue *estimate_mode,UniValue *fee_rate,UniValue *options)

{
  bool bVar1;
  UniValue *pUVar2;
  string *__lhs;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffdf8;
  UniValue in_stack_fffffffffffffe18;
  string local_180 [32];
  UniValue local_160;
  string local_108 [32];
  UniValue local_e8;
  string local_90 [32];
  string local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"conf_target",(allocator<char> *)&stack0xfffffffffffffe08);
  bVar1 = UniValue::exists(options,&local_50);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_50);
LAB_0028c333:
    if (estimate_mode->typ != VNULL || conf_target->typ != VNULL) {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "Pass conf_target and estimate_mode either as arguments or in the options object, but not both"
                 ,(allocator<char> *)&local_70);
      JSONRPCError(pUVar2,-8,&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0028c86f;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"estimate_mode",(allocator<char> *)&stack0xfffffffffffffe07);
    bVar1 = UniValue::exists(options,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) goto LAB_0028c333;
    std::__cxx11::string::string<std::allocator<char>>
              (local_90,"conf_target",(allocator<char> *)&local_50);
    UniValue::UniValue(&local_e8,conf_target);
    UniValue::pushKV(options,in_stack_fffffffffffffdf8,in_stack_fffffffffffffe18);
    UniValue::~UniValue(&local_e8);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::string<std::allocator<char>>
              (local_108,"estimate_mode",(allocator<char> *)&local_50);
    UniValue::UniValue(&local_160,estimate_mode);
    UniValue::pushKV(options,in_stack_fffffffffffffdf8,in_stack_fffffffffffffe18);
    UniValue::~UniValue(&local_160);
    std::__cxx11::string::~string(local_108);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"fee_rate",(allocator<char> *)&local_70);
  bVar1 = UniValue::exists(options,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    if (fee_rate->typ != VNULL) {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "Pass the fee_rate either as an argument, or in the options object, but not both",
                 (allocator<char> *)&local_70);
      JSONRPCError(pUVar2,-8,&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0028c86f;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_180,"fee_rate",(allocator<char> *)&local_50);
    UniValue::UniValue((UniValue *)&stack0xfffffffffffffe28,fee_rate);
    UniValue::pushKV(options,in_stack_fffffffffffffdf8,in_stack_fffffffffffffe18);
    UniValue::~UniValue((UniValue *)&stack0xfffffffffffffe28);
    std::__cxx11::string::~string(local_180);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"conf_target",(allocator<char> *)&stack0xfffffffffffffe07);
  pUVar2 = UniValue::operator[](options,&local_50);
  if (pUVar2->typ == VNULL) {
    std::__cxx11::string::~string((string *)&local_50);
LAB_0028c654:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"estimate_mode",(allocator<char> *)&stack0xfffffffffffffe06);
    pUVar2 = UniValue::operator[](options,&local_70);
    if (pUVar2->typ == VNULL) {
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffe08,"estimate_mode",
                 (allocator<char> *)&stack0xfffffffffffffe05);
      pUVar2 = UniValue::operator[](options,(string *)&stack0xfffffffffffffe08);
      __lhs = UniValue::get_str_abi_cxx11_(pUVar2);
      bVar1 = std::operator==(__lhs,"unset");
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      if (!bVar1) goto LAB_0028c654;
    }
    pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Specify estimate_mode",(allocator<char> *)&local_70);
    JSONRPCError(pUVar2,-8,&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
LAB_0028c86f:
  __stack_chk_fail();
}

Assistant:

static void InterpretFeeEstimationInstructions(const UniValue& conf_target, const UniValue& estimate_mode, const UniValue& fee_rate, UniValue& options)
{
    if (options.exists("conf_target") || options.exists("estimate_mode")) {
        if (!conf_target.isNull() || !estimate_mode.isNull()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Pass conf_target and estimate_mode either as arguments or in the options object, but not both");
        }
    } else {
        options.pushKV("conf_target", conf_target);
        options.pushKV("estimate_mode", estimate_mode);
    }
    if (options.exists("fee_rate")) {
        if (!fee_rate.isNull()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Pass the fee_rate either as an argument, or in the options object, but not both");
        }
    } else {
        options.pushKV("fee_rate", fee_rate);
    }
    if (!options["conf_target"].isNull() && (options["estimate_mode"].isNull() || (options["estimate_mode"].get_str() == "unset"))) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Specify estimate_mode");
    }
}